

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O2

void cpu_get_tb_cpu_state
               (CPUS390XState_conflict *env,target_ulong *pc,target_ulong *cs_base,uint32_t *flags)

{
  uint uVar1;
  
  *pc = (env->psw).addr;
  *cs_base = env->ex_value;
  uVar1 = (uint)((env->psw).mask >> 0x1f) & 0x88038003;
  *flags = uVar1;
  if ((env->cregs[0] & 0x60000) != 0) {
    *flags = ((uint)env->cregs[0] & 0x60000) << 0xc | uVar1;
  }
  return;
}

Assistant:

static inline void cpu_get_tb_cpu_state(CPUM68KState *env, target_ulong *pc,
                                        target_ulong *cs_base, uint32_t *flags)
{
    *pc = env->pc;
    *cs_base = 0;
    *flags = (env->macsr >> 4) & TB_FLAGS_MACSR;
    if (env->sr & SR_S) {
        *flags |= TB_FLAGS_MSR_S;
        *flags |= (env->sfc << (TB_FLAGS_SFC_S_BIT - 2)) & TB_FLAGS_SFC_S;
        *flags |= (env->dfc << (TB_FLAGS_DFC_S_BIT - 2)) & TB_FLAGS_DFC_S;
    }
}